

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ma.c
# Opt level: O2

Integer ma_nelem(Pointer address,ulongi length,Integer datatype)

{
  ulong uVar1;
  ulongi nbytes;
  Pointer client_space;
  ulong local_50;
  Pointer local_48;
  AR local_40;
  
  if (length < 0x59) {
    uVar1 = 0;
  }
  else {
    local_40.datatype = datatype;
    for (uVar1 = (length - 0x58) / (ulong)(long)ma_sizeof[datatype]; 0 < (long)uVar1;
        uVar1 = uVar1 - 1) {
      local_40.nelem = uVar1;
      balloc_after(&local_40,address,&local_48,&local_50);
      if (local_50 <= length) {
        return uVar1;
      }
    }
  }
  return uVar1;
}

Assistant:

private Integer ma_nelem(address, length, datatype)
    Pointer    address;    /* location of hypothetical block */
    ulongi    length;        /* length of hypothetical block */
    Integer    datatype;    /* of elements in hypothetical block */
{
    AR        ar;        /* allocation request */
    Pointer    client_space;    /* location of client_space */
    ulongi    nbytes;        /* length of block for ar */

    if (length <= BLOCK_OVERHEAD_FIXED)
        /* no point in computing anything */
        return (Integer)0;

    /* compute initial request */
    ar.datatype = datatype;
    ar.nelem = (length - BLOCK_OVERHEAD_FIXED) / ma_sizeof[datatype];

    /* make requests until one succeeds or we give up */
    while (ar.nelem > 0)
    {
        /* perform trial allocation to determine size */
        balloc_after(&ar, address, &client_space, &nbytes);

        if (nbytes > length)
            /* not enough space for ar.nelem elements */
            ar.nelem--;
        else
            /* enough space for ar.nelem elements */
            break;
    }

    /* return the result */
    return ar.nelem;
}